

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  byte bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  InstancePrimitive *prim;
  undefined4 uVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined1 auVar27 [16];
  uint uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24c9;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar22 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar6 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar23 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx((undefined1  [16])aVar1,auVar28);
    auVar32._8_4_ = 0x219392ef;
    auVar32._0_8_ = 0x219392ef219392ef;
    auVar32._12_4_ = 0x219392ef;
    auVar28 = vcmpps_avx(auVar28,auVar32,1);
    auVar28 = vblendvps_avx((undefined1  [16])aVar1,auVar32,auVar28);
    auVar32 = vrcpps_avx(auVar28);
    auVar33._8_4_ = 0x3f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    auVar33._12_4_ = 0x3f800000;
    auVar28 = vfnmadd231ps_fma(auVar33,auVar32,auVar28);
    auVar27 = vfmadd132ps_fma(auVar28,auVar32,auVar32);
    fVar31 = auVar27._0_4_;
    local_23c0._4_4_ = fVar31;
    local_23c0._0_4_ = fVar31;
    local_23c0._8_4_ = fVar31;
    local_23c0._12_4_ = fVar31;
    local_23c0._16_4_ = fVar31;
    local_23c0._20_4_ = fVar31;
    local_23c0._24_4_ = fVar31;
    local_23c0._28_4_ = fVar31;
    auVar36 = ZEXT3264(local_23c0);
    auVar28 = vmovshdup_avx(auVar27);
    uVar26 = auVar28._0_8_;
    local_23e0._8_8_ = uVar26;
    local_23e0._0_8_ = uVar26;
    local_23e0._16_8_ = uVar26;
    local_23e0._24_8_ = uVar26;
    auVar37 = ZEXT3264(local_23e0);
    auVar33 = vshufpd_avx(auVar27,auVar27,1);
    auVar32 = vshufps_avx(auVar27,auVar27,0xaa);
    uVar26 = auVar32._0_8_;
    local_2400._8_8_ = uVar26;
    local_2400._0_8_ = uVar26;
    local_2400._16_8_ = uVar26;
    local_2400._24_8_ = uVar26;
    auVar38 = ZEXT3264(local_2400);
    auVar34._0_4_ = fVar31 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar34._4_4_ = auVar27._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar34._8_4_ = auVar27._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar34._12_4_ = auVar27._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar32 = vmovshdup_avx(auVar34);
    auVar27 = vshufps_avx(auVar34,auVar34,0xaa);
    local_24c8 = (ulong)(fVar31 < 0.0) << 5;
    uVar19 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x40;
    uVar11 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x80;
    local_24a8 = local_24c8 ^ 0x20;
    uVar21 = auVar25._0_4_;
    auVar22 = ZEXT3264(CONCAT428(uVar21,CONCAT424(uVar21,CONCAT420(uVar21,CONCAT416(uVar21,CONCAT412
                                                  (uVar21,CONCAT48(uVar21,CONCAT44(uVar21,uVar21))))
                                                  ))));
    uVar20 = CONCAT44(auVar34._0_4_,auVar34._0_4_);
    local_2420._0_8_ = uVar20 ^ 0x8000000080000000;
    local_2420._8_4_ = -auVar34._0_4_;
    local_2420._12_4_ = -auVar34._0_4_;
    local_2420._16_4_ = -auVar34._0_4_;
    local_2420._20_4_ = -auVar34._0_4_;
    local_2420._24_4_ = -auVar34._0_4_;
    local_2420._28_4_ = -auVar34._0_4_;
    auVar35 = ZEXT3264(local_2420);
    uVar18 = auVar32._0_4_;
    uVar30 = auVar32._4_4_;
    local_2440._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
    local_2440._8_4_ = uVar18 ^ 0x80000000;
    local_2440._12_4_ = uVar30 ^ 0x80000000;
    local_2440._16_4_ = uVar18 ^ 0x80000000;
    local_2440._20_4_ = uVar30 ^ 0x80000000;
    local_2440._24_4_ = uVar18 ^ 0x80000000;
    local_2440._28_4_ = uVar30 ^ 0x80000000;
    auVar39 = ZEXT3264(local_2440);
    uVar18 = auVar27._0_4_;
    uVar30 = auVar27._4_4_;
    local_2460._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
    local_2460._8_4_ = uVar18 ^ 0x80000000;
    local_2460._12_4_ = uVar30 ^ 0x80000000;
    local_2460._16_4_ = uVar18 ^ 0x80000000;
    local_2460._20_4_ = uVar30 ^ 0x80000000;
    local_2460._24_4_ = uVar18 ^ 0x80000000;
    local_2460._28_4_ = uVar30 ^ 0x80000000;
    auVar40 = ZEXT3264(local_2460);
    uVar21 = auVar23._0_4_;
    local_2480._4_4_ = uVar21;
    local_2480._0_4_ = uVar21;
    local_2480._8_4_ = uVar21;
    local_2480._12_4_ = uVar21;
    local_2480._16_4_ = uVar21;
    local_2480._20_4_ = uVar21;
    local_2480._24_4_ = uVar21;
    local_2480._28_4_ = uVar21;
    auVar41 = ZEXT3264(local_2480);
    local_24b8 = context;
    local_24c0 = ray;
    uVar20 = local_24c8;
LAB_019b5a08:
    do {
      pauVar5 = pauVar6 + -1;
      pauVar6 = pauVar6 + -1;
      if (*(float *)(*pauVar5 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar5 = pauVar6;
        uVar16 = *(ulong *)*pauVar6;
        while (pauVar6 = pauVar5, (uVar16 & 8) == 0) {
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar20),auVar35._0_32_,
                                    auVar36._0_32_);
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar19),auVar39._0_32_,
                                    auVar37._0_32_);
          auVar3 = vpmaxsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar23));
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar11),auVar40._0_32_,
                                    auVar38._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar28),auVar41._0_32_);
          local_24a0 = vpmaxsd_avx2(auVar3,auVar4);
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + local_24a8),
                                    auVar35._0_32_,auVar36._0_32_);
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar19 ^ 0x20)),
                                    auVar39._0_32_,auVar37._0_32_);
          auVar3 = vpminsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar23));
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar11 ^ 0x20)),
                                    auVar40._0_32_,auVar38._0_32_);
          auVar4 = vpminsd_avx2(ZEXT1632(auVar28),auVar22._0_32_);
          auVar3 = vpminsd_avx2(auVar3,auVar4);
          auVar3 = vpcmpgtd_avx2(local_24a0,auVar3);
          iVar15 = vmovmskps_avx(auVar3);
          if (iVar15 == 0xff) {
            if (pauVar6 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_019b5a08;
          }
          bVar14 = ~(byte)iVar15;
          uVar7 = uVar16 & 0xfffffffffffffff0;
          lVar8 = 0;
          for (uVar16 = (ulong)bVar14; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
          {
            lVar8 = lVar8 + 1;
          }
          uVar16 = *(ulong *)(uVar7 + lVar8 * 8);
          uVar18 = bVar14 - 1 & (uint)bVar14;
          uVar9 = (ulong)uVar18;
          pauVar5 = pauVar6;
          if (uVar18 != 0) {
            uVar30 = *(uint *)(local_24a0 + lVar8 * 4);
            lVar8 = 0;
            for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar17 = (ulong)uVar18;
            uVar9 = *(ulong *)(uVar7 + lVar8 * 8);
            uVar2 = *(uint *)(local_24a0 + lVar8 * 4);
            if (uVar18 == 0) {
              pauVar5 = pauVar6 + 1;
              if (uVar30 < uVar2) {
                *(ulong *)*pauVar6 = uVar9;
                *(uint *)(*pauVar6 + 8) = uVar2;
              }
              else {
                *(ulong *)*pauVar6 = uVar16;
                *(uint *)(*pauVar6 + 8) = uVar30;
                uVar16 = uVar9;
              }
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar16;
              auVar28 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar30));
              auVar25._8_8_ = 0;
              auVar25._0_8_ = uVar9;
              auVar23 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar2));
              lVar8 = 0;
              for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar8 = lVar8 + 1;
              }
              uVar18 = uVar18 - 1 & uVar18;
              uVar16 = (ulong)uVar18;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = *(ulong *)(uVar7 + lVar8 * 8);
              auVar25 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
              if (uVar18 == 0) {
                auVar32 = vpcmpgtd_avx(auVar23,auVar28);
                auVar33 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar23,auVar28,auVar33);
                auVar28 = vblendvps_avx(auVar28,auVar23,auVar33);
                auVar23 = vpcmpgtd_avx(auVar25,auVar32);
                auVar33 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar25,auVar32,auVar33);
                auVar25 = vblendvps_avx(auVar32,auVar25,auVar33);
                auVar32 = vpcmpgtd_avx(auVar25,auVar28);
                auVar33 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar25,auVar28,auVar33);
                auVar28 = vblendvps_avx(auVar28,auVar25,auVar33);
                *pauVar6 = auVar28;
                pauVar6[1] = auVar32;
                uVar16 = auVar23._0_8_;
                pauVar5 = pauVar6 + 2;
              }
              else {
                lVar8 = 0;
                for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                  lVar8 = lVar8 + 1;
                }
                uVar18 = uVar18 - 1 & uVar18;
                uVar9 = (ulong)uVar18;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = *(ulong *)(uVar7 + lVar8 * 8);
                auVar32 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
                if (uVar18 == 0) {
                  auVar33 = vpcmpgtd_avx(auVar23,auVar28);
                  auVar27 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar23,auVar28,auVar27);
                  auVar28 = vblendvps_avx(auVar28,auVar23,auVar27);
                  auVar23 = vpcmpgtd_avx(auVar32,auVar25);
                  auVar27 = vpshufd_avx(auVar23,0xaa);
                  auVar23 = vblendvps_avx(auVar32,auVar25,auVar27);
                  auVar25 = vblendvps_avx(auVar25,auVar32,auVar27);
                  auVar32 = vpcmpgtd_avx(auVar25,auVar28);
                  auVar27 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar25,auVar28,auVar27);
                  auVar28 = vblendvps_avx(auVar28,auVar25,auVar27);
                  auVar25 = vpcmpgtd_avx(auVar23,auVar33);
                  auVar27 = vpshufd_avx(auVar25,0xaa);
                  auVar25 = vblendvps_avx(auVar23,auVar33,auVar27);
                  auVar23 = vblendvps_avx(auVar33,auVar23,auVar27);
                  auVar33 = vpcmpgtd_avx(auVar32,auVar23);
                  auVar27 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar32,auVar23,auVar27);
                  auVar23 = vblendvps_avx(auVar23,auVar32,auVar27);
                  *pauVar6 = auVar28;
                  pauVar6[1] = auVar23;
                  pauVar6[2] = auVar33;
                  uVar16 = auVar25._0_8_;
                  pauVar5 = pauVar6 + 3;
                }
                else {
                  *pauVar6 = auVar28;
                  pauVar6[1] = auVar23;
                  pauVar6[2] = auVar25;
                  pauVar6[3] = auVar32;
                  lVar8 = 0x30;
                  do {
                    lVar12 = lVar8;
                    lVar8 = 0;
                    for (uVar16 = uVar9; (uVar16 & 1) == 0;
                        uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                      lVar8 = lVar8 + 1;
                    }
                    uVar16 = *(ulong *)(uVar7 + lVar8 * 8);
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = uVar16;
                    auVar28 = vpunpcklqdq_avx(auVar24,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
                    *(undefined1 (*) [16])(pauVar6[1] + lVar12) = auVar28;
                    uVar9 = uVar9 - 1 & uVar9;
                    lVar8 = lVar12 + 0x10;
                  } while (uVar9 != 0);
                  pauVar5 = (undefined1 (*) [16])(pauVar6[1] + lVar12);
                  if (lVar12 + 0x10 != 0) {
                    lVar8 = 0x10;
                    pauVar10 = pauVar6;
                    do {
                      auVar28 = pauVar10[1];
                      pauVar10 = pauVar10 + 1;
                      uVar18 = vextractps_avx(auVar28,2);
                      lVar12 = lVar8;
                      do {
                        if (uVar18 <= *(uint *)(pauVar6[-1] + lVar12 + 8)) {
                          pauVar13 = (undefined1 (*) [16])(*pauVar6 + lVar12);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar6 + lVar12) =
                             *(undefined1 (*) [16])(pauVar6[-1] + lVar12);
                        lVar12 = lVar12 + -0x10;
                        pauVar13 = pauVar6;
                      } while (lVar12 != 0);
                      *pauVar13 = auVar28;
                      lVar8 = lVar8 + 0x10;
                    } while (pauVar5 != pauVar10);
                    uVar16 = *(ulong *)*pauVar5;
                  }
                }
              }
            }
          }
        }
        local_24b0 = (ulong)((uint)uVar16 & 0xf) - 8;
        if (local_24b0 != 0) {
          prim = (InstancePrimitive *)(uVar16 & 0xfffffffffffffff0);
          do {
            InstanceIntersector1::intersect(&local_24c9,ray,context,prim);
            prim = prim + 1;
            local_24b0 = local_24b0 + -1;
            context = local_24b8;
            ray = local_24c0;
          } while (local_24b0 != 0);
        }
        fVar31 = (ray->super_RayK<1>).tfar;
        auVar22 = ZEXT3264(CONCAT428(fVar31,CONCAT424(fVar31,CONCAT420(fVar31,CONCAT416(fVar31,
                                                  CONCAT412(fVar31,CONCAT48(fVar31,CONCAT44(fVar31,
                                                  fVar31))))))));
        auVar36 = ZEXT3264(local_23c0);
        auVar37 = ZEXT3264(local_23e0);
        auVar38 = ZEXT3264(local_2400);
        auVar35 = ZEXT3264(local_2420);
        auVar39 = ZEXT3264(local_2440);
        auVar40 = ZEXT3264(local_2460);
        auVar41 = ZEXT3264(local_2480);
        uVar20 = local_24c8;
      }
    } while (pauVar6 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }